

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O0

void __thiscall
cmCPackIFWPackage::DependenceStruct::DependenceStruct(DependenceStruct *this,string *dependence)

{
  string local_118 [32];
  long local_f8;
  size_t dashPos;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  long local_30;
  size_t pos;
  string *local_18;
  string *dependence_local;
  DependenceStruct *this_local;
  
  local_18 = dependence;
  dependence_local = &this->Name;
  std::__cxx11::string::string((string *)this);
  CompareStruct::CompareStruct(&this->Compare);
  local_30 = 0xffffffffffffffff;
  local_30 = std::__cxx11::string::find((char *)local_18,0xada41f);
  if (local_30 == -1) {
    local_30 = std::__cxx11::string::find((char *)local_18,0xada422);
    if (local_30 == -1) {
      local_30 = std::__cxx11::string::find((char)local_18,0x3c);
      if (local_30 == -1) {
        local_30 = std::__cxx11::string::find((char)local_18,0x3d);
        if (local_30 == -1) {
          local_30 = std::__cxx11::string::find((char)local_18,0x3e);
          if (local_30 == -1) {
            local_30 = std::__cxx11::string::find((char)local_18,0x2d);
            if (local_30 != -1) {
              (this->Compare).Type = 0;
              std::__cxx11::string::substr((ulong)&dashPos,(ulong)local_18);
              std::__cxx11::string::operator=((string *)&(this->Compare).Value,(string *)&dashPos);
              std::__cxx11::string::~string((string *)&dashPos);
            }
          }
          else {
            (this->Compare).Type = 4;
            std::__cxx11::string::substr((ulong)local_d0,(ulong)local_18);
            std::__cxx11::string::operator=((string *)&(this->Compare).Value,local_d0);
            std::__cxx11::string::~string(local_d0);
          }
        }
        else {
          (this->Compare).Type = 1;
          std::__cxx11::string::substr((ulong)local_b0,(ulong)local_18);
          std::__cxx11::string::operator=((string *)&(this->Compare).Value,local_b0);
          std::__cxx11::string::~string(local_b0);
        }
      }
      else {
        (this->Compare).Type = 2;
        std::__cxx11::string::substr((ulong)local_90,(ulong)local_18);
        std::__cxx11::string::operator=((string *)&(this->Compare).Value,local_90);
        std::__cxx11::string::~string(local_90);
      }
    }
    else {
      (this->Compare).Type = 5;
      std::__cxx11::string::substr((ulong)local_70,(ulong)local_18);
      std::__cxx11::string::operator=((string *)&(this->Compare).Value,local_70);
      std::__cxx11::string::~string(local_70);
    }
  }
  else {
    (this->Compare).Type = 3;
    std::__cxx11::string::substr((ulong)local_50,(ulong)local_18);
    std::__cxx11::string::operator=((string *)&(this->Compare).Value,local_50);
    std::__cxx11::string::~string(local_50);
  }
  local_f8 = std::__cxx11::string::find((char)local_18,0x2d);
  if (local_f8 != -1) {
    local_30 = local_f8;
  }
  if (local_30 == -1) {
    std::__cxx11::string::string(local_118,(string *)local_18);
  }
  else {
    std::__cxx11::string::substr((ulong)local_118,(ulong)local_18);
  }
  std::__cxx11::string::operator=((string *)this,local_118);
  std::__cxx11::string::~string(local_118);
  return;
}

Assistant:

cmCPackIFWPackage::DependenceStruct::DependenceStruct(
  const std::string& dependence)
{
  // Search compare section
  size_t pos = std::string::npos;
  if ((pos = dependence.find("<=")) != std::string::npos) {
    this->Compare.Type = cmCPackIFWPackage::CompareLessOrEqual;
    this->Compare.Value = dependence.substr(pos + 2);
  } else if ((pos = dependence.find(">=")) != std::string::npos) {
    this->Compare.Type = cmCPackIFWPackage::CompareGreaterOrEqual;
    this->Compare.Value = dependence.substr(pos + 2);
  } else if ((pos = dependence.find('<')) != std::string::npos) {
    this->Compare.Type = cmCPackIFWPackage::CompareLess;
    this->Compare.Value = dependence.substr(pos + 1);
  } else if ((pos = dependence.find('=')) != std::string::npos) {
    this->Compare.Type = cmCPackIFWPackage::CompareEqual;
    this->Compare.Value = dependence.substr(pos + 1);
  } else if ((pos = dependence.find('>')) != std::string::npos) {
    this->Compare.Type = cmCPackIFWPackage::CompareGreater;
    this->Compare.Value = dependence.substr(pos + 1);
  } else if ((pos = dependence.find('-')) != std::string::npos) {
    this->Compare.Type = cmCPackIFWPackage::CompareNone;
    this->Compare.Value = dependence.substr(pos + 1);
  }
  size_t dashPos = dependence.find('-');
  if (dashPos != std::string::npos) {
    pos = dashPos;
  }
  this->Name =
    pos == std::string::npos ? dependence : dependence.substr(0, pos);
}